

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

void __thiscall ThreadPool::WorkOrWait(ThreadPool *this,unique_lock<std::mutex> *lock)

{
  int iVar1;
  ParallelJob *pPVar2;
  
  pPVar2 = this->jobList;
  while( true ) {
    if (pPVar2 == (ParallelJob *)0x0) {
      std::condition_variable::wait((unique_lock *)&this->jobListCondition);
      return;
    }
    iVar1 = (*pPVar2->_vptr_ParallelJob[3])(pPVar2);
    if ((char)iVar1 != '\0') break;
    pPVar2 = pPVar2->next;
  }
  pPVar2->activeWorkers = pPVar2->activeWorkers + 1;
  (*pPVar2->_vptr_ParallelJob[2])(pPVar2,lock);
  std::unique_lock<std::mutex>::lock(lock);
  pPVar2->activeWorkers = pPVar2->activeWorkers + -1;
  iVar1 = (*pPVar2->_vptr_ParallelJob[3])(pPVar2);
  if (((char)iVar1 == '\0') && (pPVar2->activeWorkers == 0)) {
    std::condition_variable::notify_all();
    return;
  }
  return;
}

Assistant:

void ThreadPool::WorkOrWait(std::unique_lock<std::mutex> *lock) {
    assert(lock->owns_lock());

    ParallelJob *job = jobList;
    while ((job != nullptr) && !job->HaveWork())
        job = job->next;
    if (job != nullptr) {
        // Run a chunk of loop iterations for _loop_
        job->activeWorkers++;

        job->RunStep(lock);

        assert(!lock->owns_lock());
        lock->lock();

        // Update _loop_ to reflect completion of iterations
        job->activeWorkers--;

        if (job->Finished())
            jobListCondition.notify_all();
    } else
        // Wait for something to change (new work, or this loop being
        // finished).
        jobListCondition.wait(*lock);
}